

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QRegion __thiscall QWidgetPrivate::clipRegion(QWidgetPrivate *this)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  int iVar3;
  Representation RVar4;
  QWidgetData *pQVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long in_RSI;
  Representation RVar10;
  int iVar11;
  Representation RVar12;
  QWidget *pQVar13;
  QWidget *this_00;
  long in_FS_OFFSET;
  QRegion local_50;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)(in_RSI + 8);
  if ((pQVar1->data->widget_attributes & 0x8000) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_002fd793:
      __stack_chk_fail();
    }
    QRegion::QRegion((QRegion *)this);
  }
  else {
    *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = pQVar1->data;
    local_48._8_4_ = (pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i;
    RStack_3c.m_i = (pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i;
    local_48._0_8_ = (QRegionData *)0x0;
    QRegion::QRegion((QRegion *)this,(QRect *)local_48,Rectangle);
    pQVar5 = pQVar1->data;
    if ((pQVar5->widget_attributes & 0x8000) != 0) {
      iVar9 = 0;
      iVar11 = 0;
      pQVar13 = pQVar1;
      do {
        if ((((pQVar5->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) ||
           (*(long *)(*(long *)&pQVar13->field_0x8 + 0x10) == 0)) break;
        iVar3 = QWidget::x(pQVar13);
        iVar11 = iVar11 - iVar3;
        iVar3 = QWidget::y(pQVar13);
        iVar9 = iVar9 - iVar3;
        pQVar2 = *(QWidget **)(*(long *)&pQVar13->field_0x8 + 0x10);
        pQVar5 = pQVar2->data;
        QRegion::QRegion((QRegion *)local_48,iVar11,iVar9,
                         ((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1,
                         ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1,Rectangle);
        QRegion::operator&=((QRegion *)this,(QRegion *)local_48);
        QRegion::~QRegion((QRegion *)local_48);
        uVar7 = 0;
        do {
          uVar8 = uVar7 + 1;
          lVar6 = uVar7 * 8;
          uVar7 = uVar8;
        } while (*(QWidget **)(*(long *)(*(long *)&pQVar2->field_0x8 + 0x20) + lVar6) != pQVar13);
        lVar6 = *(long *)&pQVar2->field_0x8;
        if ((uVar8 & 0xffffffff) < *(ulong *)(lVar6 + 0x28)) {
          do {
            pQVar13 = *(QWidget **)(*(long *)(lVar6 + 0x20) + uVar8 * 8);
            if (pQVar13 == (QWidget *)0x0) {
              this_00 = (QWidget *)0x0;
            }
            else {
              this_00 = (QWidget *)0x0;
              if ((*(byte *)(*(long *)&pQVar13->field_0x8 + 0x30) & 1) != 0) {
                this_00 = pQVar13;
              }
            }
            if (((this_00 != (QWidget *)0x0) && ((this_00->data->widget_attributes & 0x8000) != 0))
               && (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
              local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
              iVar3 = QWidget::x(this_00);
              RVar12.m_i = iVar3 + iVar11;
              iVar3 = QWidget::y(this_00);
              RVar4.m_i = iVar3 + iVar9;
              pQVar5 = this_00->data;
              local_48._8_4_ = ((pQVar5->crect).x2.m_i + RVar12.m_i) - (pQVar5->crect).x1.m_i;
              RStack_3c.m_i = ((pQVar5->crect).y2.m_i + RVar4.m_i) - (pQVar5->crect).y1.m_i;
              local_48._4_4_ = RVar4.m_i;
              local_48._0_4_ = RVar12.m_i;
              pQVar5 = pQVar1->data;
              RVar10.m_i = (pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i;
              if (RVar12.m_i < 1) {
                RVar12.m_i = 0;
              }
              if ((int)local_48._8_4_ < RVar10.m_i) {
                RVar10.m_i = local_48._8_4_;
              }
              if (RVar12.m_i <= RVar10.m_i) {
                RVar12.m_i = (pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i;
                if (RVar4.m_i < 1) {
                  RVar4.m_i = 0;
                }
                if (RStack_3c.m_i < RVar12.m_i) {
                  RVar12.m_i = RStack_3c.m_i;
                }
                if (RVar4.m_i <= RVar12.m_i) {
                  QRegion::QRegion(&local_50,(QRect *)local_48,Rectangle);
                  QRegion::operator-=((QRegion *)this,&local_50);
                  QRegion::~QRegion(&local_50);
                }
              }
            }
            uVar8 = uVar8 + 1;
            lVar6 = *(long *)&pQVar2->field_0x8;
          } while (uVar8 < *(ulong *)(lVar6 + 0x28));
        }
        pQVar5 = pQVar2->data;
        pQVar13 = pQVar2;
      } while ((pQVar5->widget_attributes & 0x8000) != 0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_002fd793;
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QWidgetPrivate::clipRegion() const
{
    Q_Q(const QWidget);
    if (!q->isVisible())
        return QRegion();
    QRegion r(q->rect());
    const QWidget * w = q;
    const QWidget *ignoreUpTo;
    int ox = 0;
    int oy = 0;
    while (w
           && w->isVisible()
           && !w->isWindow()
           && w->parentWidget()) {
        ox -= w->x();
        oy -= w->y();
        ignoreUpTo = w;
        w = w->parentWidget();
        r &= QRegion(ox, oy, w->width(), w->height());

        int i = 0;
        while(w->d_func()->children.at(i++) != static_cast<const QObject *>(ignoreUpTo))
            ;
        for ( ; i < w->d_func()->children.size(); ++i) {
            if (QWidget *sibling = qobject_cast<QWidget *>(w->d_func()->children.at(i))) {
                if (sibling->isVisible() && !sibling->isWindow()) {
                    QRect siblingRect(ox+sibling->x(), oy+sibling->y(),
                                      sibling->width(), sibling->height());
                    if (qRectIntersects(siblingRect, q->rect()))
                        r -= QRegion(siblingRect);
                }
            }
        }
    }
    return r;
}